

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::InitSCCImpl(SCCInfoBase *scc)

{
  bool bVar1;
  int iVar2;
  id __y;
  id __x;
  LogMessage *this;
  int *in_RDI;
  id me;
  memory_order __b;
  LogMessage *other;
  LogMessage *in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff60;
  id local_98;
  native_handle_type local_90;
  byte local_71;
  SCCInfoBase *in_stack_ffffffffffffff98;
  
  if ((InitSCCImpl(google::protobuf::internal::SCCInfoBase*)::runner == '\0') &&
     (iVar2 = __cxa_guard_acquire(&InitSCCImpl(google::protobuf::internal::SCCInfoBase*)::runner),
     iVar2 != 0)) {
    std::atomic<std::thread::id>::atomic((atomic<std::thread::id> *)0x3e0e65);
    __cxa_guard_release(&InitSCCImpl(google::protobuf::internal::SCCInfoBase*)::runner);
  }
  __y = std::this_thread::get_id();
  __x = std::atomic<std::thread::id>::load(&InitSCCImpl::runner,memory_order_relaxed);
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    std::operator&(memory_order_relaxed,__memory_order_mask);
    local_71 = 0;
    if (*in_RDI != 1) {
      other = (LogMessage *)&stack0xffffffffffffff90;
      LogMessage::LogMessage
                ((LogMessage *)(ulong)in_stack_ffffffffffffff60,
                 (LogLevel_conflict)((ulong)in_RDI >> 0x20),(char *)in_stack_ffffffffffffff50,
                 (int)((ulong)other >> 0x20));
      local_71 = 1;
      this = LogMessage::operator<<(in_stack_ffffffffffffff50,(char *)other);
      LogFinisher::operator=((LogFinisher *)this,other);
    }
    if ((local_71 & 1) != 0) {
      LogMessage::~LogMessage((LogMessage *)0x3e0fc3);
    }
  }
  else {
    InitProtobufDefaults();
    WrappedMutex::Lock((WrappedMutex *)0x3e0ffc);
    local_90 = __y._M_thread;
    std::atomic<std::thread::id>::store(&InitSCCImpl::runner,__y,memory_order_relaxed);
    anon_unknown_137::InitSCC_DFS(in_stack_ffffffffffffff98);
    std::thread::id::id(&local_98);
    std::atomic<std::thread::id>::store(&InitSCCImpl::runner,local_98,memory_order_relaxed);
    WrappedMutex::Unlock((WrappedMutex *)0x3e1052);
  }
  return;
}

Assistant:

void InitSCCImpl(SCCInfoBase* scc) {
  static WrappedMutex mu{GOOGLE_PROTOBUF_LINKER_INITIALIZED};
  // Either the default in case no initialization is running or the id of the
  // thread that is currently initializing.
#ifndef GOOGLE_PROTOBUF_SUPPORT_WINDOWS_XP
  static std::atomic<std::thread::id> runner;
  auto me = std::this_thread::get_id();
#else
  // This is a lightweight replacement for std::thread::id. std::thread does not
  // work on Windows XP SP2 with the latest VC++ libraries, because it utilizes
  // the Concurrency Runtime that is only supported on Windows XP SP3 and above.
  static std::atomic_llong runner(-1);
  auto me = ::GetCurrentThreadId();
#endif  // #ifndef GOOGLE_PROTOBUF_SUPPORT_WINDOWS_XP

  // This will only happen because the constructor will call InitSCC while
  // constructing the default instance.
  if (runner.load(std::memory_order_relaxed) == me) {
    // Because we're in the process of constructing the default instance.
    // We can be assured that we're already exploring this SCC.
    GOOGLE_CHECK_EQ(scc->visit_status.load(std::memory_order_relaxed),
             SCCInfoBase::kRunning);
    return;
  }
  InitProtobufDefaults();
  mu.Lock();
  runner.store(me, std::memory_order_relaxed);
  InitSCC_DFS(scc);

#ifndef GOOGLE_PROTOBUF_SUPPORT_WINDOWS_XP
  runner.store(std::thread::id{}, std::memory_order_relaxed);
#else
  runner.store(-1, std::memory_order_relaxed);
#endif  // #ifndef GOOGLE_PROTOBUF_SUPPORT_WINDOWS_XP

  mu.Unlock();
}